

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  byte bVar1;
  MCode *pMVar2;
  int iVar3;
  uint uVar4;
  Reg rb;
  IRIns *pIVar5;
  int iVar6;
  int in_EDX;
  IRIns *in_RSI;
  ASMState *in_RDI;
  x86Op xo;
  Reg left;
  IRRef tmp;
  MCode *q;
  MCode *p;
  int32_t k;
  Reg right;
  Reg dest;
  RegSet allow;
  IRRef rref;
  IRRef lref;
  IRIns *in_stack_ffffffffffffffa8;
  RegSet in_stack_ffffffffffffffb0;
  IRRef in_stack_ffffffffffffffb4;
  x86Op xo_00;
  IRRef in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  IRIns *in_stack_ffffffffffffffc0;
  int32_t local_2c;
  uint local_28;
  Reg local_24;
  uint local_20;
  IRRef local_1c;
  uint local_18;
  int local_14;
  IRIns *local_10;
  ASMState *local_8;
  
  local_18 = (uint)(in_RSI->field_0).op1;
  local_1c = (IRRef)(in_RSI->field_0).op2;
  local_20 = 0xffef;
  local_2c = 0;
  if (in_RDI->flagmcp == in_RDI->mcp) {
    iVar6 = 2;
    if (*in_RDI->mcp < 0x84) {
      iVar6 = 3;
    }
    pIVar5 = (IRIns *)(in_RDI->mcp + iVar6);
    in_stack_ffffffffffffffa8 = pIVar5;
    if (*(byte *)pIVar5 == 0xf) {
      in_stack_ffffffffffffffa8 = (IRIns *)((long)pIVar5 + 1);
    }
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffa8;
    if ((*(byte *)in_stack_ffffffffffffffa8 & 0xf) < 0xe) {
      if (0xb < (*(byte *)in_stack_ffffffffffffffa8 & 0xf)) {
        *(byte *)in_stack_ffffffffffffffa8 = *(byte *)in_stack_ffffffffffffffa8 - 4;
      }
      in_RDI->flagmcp = (MCode *)0x0;
      in_RDI->mcp = (MCode *)pIVar5;
    }
  }
  bVar1 = *(byte *)((long)in_RDI->ir + (ulong)local_1c * 8 + 6);
  local_28 = (uint)bVar1;
  if ((bVar1 & 0x80) == 0) {
    local_20 = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & 0xffef;
    in_RDI->weakset = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,0);
  iVar6 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar4 = local_24;
  if (((local_18 != local_1c) && (uVar4 = local_28, (local_28 & 0x80) != 0)) &&
     (iVar3 = asm_isk32(local_8,local_1c,&local_2c), uVar4 = local_28, iVar3 == 0)) {
    iVar3 = asm_swapops(local_8,local_10);
    uVar4 = local_18;
    if (iVar3 != 0) {
      local_18 = local_1c;
      local_1c = uVar4;
      in_stack_ffffffffffffffbc = uVar4;
    }
    local_20 = (1 << ((byte)local_24 & 0x1f) ^ 0xffffffffU) & local_20;
    uVar4 = asm_fuseloadm((ASMState *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,iVar6);
  }
  local_28 = uVar4;
  if (((local_10->field_1).t.irt & 0x80) != 0) {
    asm_guardcc((ASMState *)&in_stack_ffffffffffffffc0->field_0,in_stack_ffffffffffffffbc);
  }
  if (local_14 == 8) {
    if ((local_28 & 0x80) != 0) {
      rb = asm_fuseloadm((ASMState *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,iVar6);
      if (local_2c == (char)(MCode)local_2c) {
        pMVar2 = local_8->mcp;
        local_8->mcp = pMVar2 + -1;
        pMVar2[-1] = (MCode)local_2c;
        xo_00 = XO_IMULi8;
      }
      else {
        *(int32_t *)(local_8->mcp + -4) = local_2c;
        local_8->mcp = local_8->mcp + -4;
        xo_00 = XO_IMULi;
      }
      iVar6 = 0;
      if ((0x604208U >> ((local_10->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar6 = 0x80200;
      }
      emit_mrm(local_8,xo_00,local_24 + iVar6,rb);
      return;
    }
    iVar6 = 0;
    if ((0x604208U >> ((local_10->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar6 = 0x80200;
    }
    emit_mrm(local_8,XO_IMUL,local_24 + iVar6,local_28);
  }
  else if ((local_28 & 0x80) == 0) {
    iVar6 = 0;
    if ((0x604208U >> ((local_10->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar6 = 0x80200;
    }
    emit_mrm(local_8,local_14 * 0x8000000 + 0x30000fe,local_24 + iVar6,local_28);
  }
  else {
    iVar6 = 0;
    if ((0x604208U >> ((local_10->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar6 = 0x80200;
    }
    emit_gri(local_8,local_14 + 0x838100,local_24 + iVar6,local_2c);
  }
  ra_left((ASMState *)&in_stack_ffffffffffffffc0->field_0,in_stack_ffffffffffffffbc,
          in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    MCode *q = p[0] == 0x0f ? p+1 : p;
    if ((*q & 15) < 14) {
      if ((*q & 15) >= 12) *q -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}